

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O0

bool anon_unknown.dwarf_212e3b::compare
               (FrameBuffer *asRead,FrameBuffer *asWritten,Box2i *dataWindow)

{
  PixelType PVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  unsigned_short uVar5;
  Slice *pSVar6;
  ostream *poVar7;
  char *pcVar8;
  void *this;
  int *in_RDX;
  long lVar9;
  long lVar10;
  char *in_stack_00000040;
  FrameBuffer *in_stack_00000048;
  char *ptr_1;
  half writtenHalf;
  half readHalf;
  char *ptr;
  int x;
  int y;
  ConstIterator p;
  ConstIterator i;
  FrameBuffer *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  const_iterator *in_stack_ffffffffffffff50;
  unsigned_short local_5e;
  unsigned_short local_5a;
  half local_48;
  unsigned_short local_46;
  unsigned_short local_44;
  half local_42;
  unsigned_short *local_40;
  int local_38;
  int local_34;
  const_iterator local_30;
  const_iterator local_28;
  const_iterator local_20;
  int *local_18;
  
  local_18 = in_RDX;
  local_20._M_node = (_Base_ptr)Imf_2_5::FrameBuffer::begin(in_stack_ffffffffffffff38);
  do {
    local_28._M_node = (_Base_ptr)Imf_2_5::FrameBuffer::end(in_stack_ffffffffffffff38);
    bVar4 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                (ConstIterator *)in_stack_ffffffffffffff38);
    if (!bVar4) {
      return true;
    }
    Imf_2_5::FrameBuffer::ConstIterator::name((ConstIterator *)0x222031);
    local_30._M_node = (_Base_ptr)Imf_2_5::FrameBuffer::find(in_stack_00000048,in_stack_00000040);
    for (local_34 = local_18[1]; local_34 <= local_18[3]; local_34 = local_34 + 1) {
      for (local_38 = *local_18; local_38 <= local_18[2]; local_38 = local_38 + 1) {
        pSVar6 = Imf_2_5::FrameBuffer::ConstIterator::slice((ConstIterator *)0x2220ab);
        pcVar8 = pSVar6->base;
        pSVar6 = Imf_2_5::FrameBuffer::ConstIterator::slice((ConstIterator *)0x2220be);
        sVar2 = pSVar6->yStride;
        lVar9 = (long)local_34;
        pSVar6 = Imf_2_5::FrameBuffer::ConstIterator::slice((ConstIterator *)0x2220e8);
        local_40 = (unsigned_short *)(pcVar8 + pSVar6->xStride * (long)local_38 + sVar2 * lVar9);
        pSVar6 = Imf_2_5::FrameBuffer::ConstIterator::slice((ConstIterator *)0x222115);
        PVar1 = pSVar6->type;
        if (PVar1 != UINT) {
          if (PVar1 == HALF) {
            local_46 = *local_40;
            local_42._h = local_46;
          }
          else {
            if (PVar1 != FLOAT) {
              std::operator<<((ostream *)&std::cout,"don\'t know about that\n");
              exit(1);
            }
            half::half((half *)in_stack_ffffffffffffff50,
                       (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            local_42._h = local_44;
          }
          Imf_2_5::FrameBuffer::end(in_stack_ffffffffffffff38);
          bVar4 = Imf_2_5::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                      (ConstIterator *)in_stack_ffffffffffffff38);
          if (bVar4) {
            in_stack_ffffffffffffff50 = &local_30;
            pSVar6 = Imf_2_5::FrameBuffer::ConstIterator::slice((ConstIterator *)0x2221e8);
            pcVar8 = pSVar6->base;
            pSVar6 = Imf_2_5::FrameBuffer::ConstIterator::slice((ConstIterator *)0x2221fb);
            sVar2 = pSVar6->yStride;
            lVar9 = (long)local_34;
            in_stack_ffffffffffffff48 = pcVar8;
            pSVar6 = Imf_2_5::FrameBuffer::ConstIterator::slice((ConstIterator *)0x222225);
            sVar3 = pSVar6->xStride;
            lVar10 = (long)local_38;
            pSVar6 = Imf_2_5::FrameBuffer::ConstIterator::slice((ConstIterator *)0x22224f);
            PVar1 = pSVar6->type;
            if (PVar1 == UINT) goto LAB_0022240a;
            if (PVar1 == HALF) {
              local_48._h = *(unsigned_short *)(pcVar8 + sVar3 * lVar10 + sVar2 * lVar9);
            }
            else {
              if (PVar1 != FLOAT) {
                std::operator<<((ostream *)&std::cout,"don\'t know about that\n");
                exit(1);
              }
              half::half((half *)in_stack_ffffffffffffff50,
                         (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              local_48._h = local_5a;
            }
          }
          else {
            Imf_2_5::FrameBuffer::ConstIterator::slice((ConstIterator *)0x2222e0);
            half::half((half *)in_stack_ffffffffffffff50,
                       (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            local_48._h = local_5e;
          }
          uVar5 = half::bits(&local_48);
          in_stack_ffffffffffffff44 = (uint)uVar5;
          uVar5 = half::bits(&local_42);
          if (in_stack_ffffffffffffff44 != uVar5) {
            poVar7 = std::operator<<((ostream *)&std::cout,"\n\nerror reading back channel ");
            pcVar8 = Imf_2_5::FrameBuffer::ConstIterator::name((ConstIterator *)0x222357);
            poVar7 = std::operator<<(poVar7,pcVar8);
            poVar7 = std::operator<<(poVar7," pixel ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_38);
            poVar7 = std::operator<<(poVar7,',');
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_34);
            poVar7 = std::operator<<(poVar7," got ");
            poVar7 = (ostream *)::operator<<(poVar7,local_42);
            poVar7 = std::operator<<(poVar7," expected ");
            this = (void *)::operator<<(poVar7,local_48);
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            exit(1);
          }
        }
LAB_0022240a:
      }
    }
    Imf_2_5::FrameBuffer::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffff38,0);
  } while( true );
}

Assistant:

bool compare(const FrameBuffer& asRead,
             const FrameBuffer& asWritten,
             const Box2i& dataWindow
            )
{
    for (FrameBuffer::ConstIterator i =asRead.begin();i!=asRead.end();i++)
    {
        FrameBuffer::ConstIterator p = asWritten.find(i.name());
        for (int y=dataWindow.min.y; y<= dataWindow.max.y; y++)
        {
            for (int x = dataWindow.min.x; x <= dataWindow.max.x; x++)
                 
            {
                char * ptr = (i.slice().base+i.slice().yStride*intptr_t(y) +i.slice().xStride*intptr_t(x));
                half readHalf;
                switch (i.slice().type)
                {
                    case IMF::FLOAT :
                        readHalf =  half(*(float*) ptr);
                        break;
                    case IMF::HALF :
                        readHalf = half(*(half*) ptr);
                        break;
                    case IMF::UINT :
                        continue; // can't very well check this
                    default :
                        cout << "don't know about that\n";
                        exit(1);
                }
                
                half writtenHalf;

                if (p!=asWritten.end())
                {
                    char * ptr = p.slice().base+p.slice().yStride*intptr_t(y) +
                                 p.slice().xStride*intptr_t(x);
                    switch (p.slice().type)
                    {
                    case IMF::FLOAT :
                        writtenHalf = half(*(float*) ptr);
                        break;
                    case IMF::HALF :
                        writtenHalf = half(*(half*) ptr);
                        break;
                    case IMF::UINT :
                        continue;
                    default :
                        cout << "don't know about that\n";
                        exit(1);
                    }
                }
                else
                {
                    writtenHalf=half(i.slice().fillValue);
                }

                if (writtenHalf.bits()!=readHalf.bits())
                {
                        cout << "\n\nerror reading back channel " << i.name() << " pixel " << x << ',' << y << " got " << readHalf << " expected " << writtenHalf << endl;
                        assert(writtenHalf.bits()==readHalf.bits());
                        exit(1);
                    
                }             
            }

        }
    }
    return true;
}